

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueSymbol.cpp
# Opt level: O1

void __thiscall
slang::ast::ValueSymbol::addDriverFromSideEffect(ValueSymbol *this,ValueDriver *newDriver)

{
  char *pcVar1;
  DriverBitRange bounds_00;
  Type *rootType;
  Expression *prefixExpression;
  optional<std::pair<unsigned_long,_unsigned_long>_> bounds;
  _Storage<std::pair<unsigned_long,_unsigned_long>,_true> local_388;
  char local_378;
  EvalContext local_370;
  
  local_370.astCtx.scope.ptr = (this->super_Symbol).parentScope;
  local_370.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_ =
       (pointer)local_370.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.firstElement;
  local_370.astCtx.instanceOrProc = (Symbol *)0x0;
  local_370.astCtx.firstTempVar = (TempVarSymbol *)0x0;
  local_370.astCtx.randomizeDetails = (RandomizeDetails *)0x0;
  local_370.astCtx.assertionInstance = (AssertionInstanceDetails *)0x0;
  local_370.astCtx.lookupIndex = 0xffffffff;
  local_370.astCtx.flags.m_bits = 0;
  local_370.flags.m_bits = '\0';
  local_370._60_8_ = 0;
  local_370._68_8_ = 0;
  local_370.queueTarget._4_4_ = 0;
  local_370.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.len = 0;
  local_370.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.cap = 2;
  pcVar1 = local_370.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.firstElement;
  local_370.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len = 0;
  local_370.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.cap = 5;
  local_370.diags.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>
  .data_ = (pointer)local_370.diags.super_SmallVector<slang::Diagnostic,_2UL>.
                    super_SmallVectorBase<slang::Diagnostic>.firstElement;
  local_370.diags.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>
  .len = 0;
  local_370.diags.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>
  .cap = 2;
  local_370.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)local_370.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  local_370.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  local_370.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  local_370.backtraceReported = false;
  local_370.disableRange.startLoc = (SourceLocation)0x0;
  local_370.disableRange.endLoc = (SourceLocation)0x0;
  prefixExpression = (newDriver->prefixExpression).ptr;
  local_370.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ = (pointer)pcVar1;
  rootType = DeclaredType::getType(&this->declaredType);
  ValueDriver::getBounds
            ((optional<std::pair<unsigned_long,_unsigned_long>_> *)&local_388._M_value,
             prefixExpression,&local_370,rootType);
  if (local_378 != '\0') {
    bounds_00.second = local_388._M_value.second;
    bounds_00.first = local_388._M_value.first;
    addDriver(this,bounds_00,newDriver);
    prefixExpression = (Expression *)local_388._M_value.first;
  }
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)&local_370.warnings,
             (EVP_PKEY_CTX *)prefixExpression);
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)&local_370.diags,(EVP_PKEY_CTX *)prefixExpression
            );
  if (local_370.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ != (pointer)pcVar1) {
    operator_delete(local_370.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_);
  }
  SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup
            (&local_370.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>,
             (EVP_PKEY_CTX *)prefixExpression);
  return;
}

Assistant:

void ValueSymbol::addDriverFromSideEffect(const ValueDriver& newDriver) const {
    auto scope = getParentScope();
    SLANG_ASSERT(scope);

    EvalContext evalCtx(ASTContext(*scope, LookupLocation::max));
    auto bounds = ValueDriver::getBounds(*newDriver.prefixExpression, evalCtx, getType());
    if (!bounds)
        return;

    addDriver(*bounds, newDriver);
}